

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_39(QPDF *pdf,char *arg2)

{
  long *plVar1;
  ostream *poVar2;
  _Base_ptr p_Var3;
  QPDFObjectHandle image_dict;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  images;
  int local_13c;
  long local_138;
  long *local_130 [2];
  long local_120 [2];
  long *local_110;
  long local_108;
  long local_100 [2];
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  long local_b0;
  long local_a8;
  long local_a0;
  string local_90 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  string local_80 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
  local_60;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_60,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)&local_60);
  local_138 = local_a8;
  local_b0 = local_a0;
  if (local_a8 != local_a0) {
    local_13c = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"page ",5);
      local_13c = local_13c + 1;
      plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_13c);
      std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
      std::ostream::put((char)plVar1);
      std::ostream::flush();
      QPDFPageObjectHelper::getImages_abi_cxx11_();
      for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &local_60._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        QPDFObjectHandle::getDict();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"filter: ",8);
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"/Filter","");
        QPDFObjectHandle::getKey(local_80);
        QPDFObjectHandle::unparseResolved_abi_cxx11_();
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(char *)local_d0,local_c8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", color space: ",0xf);
        local_130[0] = local_120;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"/ColorSpace","");
        QPDFObjectHandle::getKey(local_90);
        QPDFObjectHandle::unparseResolved_abi_cxx11_();
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar2,(char *)local_110,local_108);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
        std::ostream::put((char)poVar2);
        std::ostream::flush();
        if (local_110 != local_100) {
          operator_delete(local_110,local_100[0] + 1);
        }
        if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
        }
        if (local_130[0] != local_120) {
          operator_delete(local_130[0],local_120[0] + 1);
        }
        if (local_d0 != local_c0) {
          operator_delete(local_d0,local_c0[0] + 1);
        }
        if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
        }
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0],local_e0[0] + 1);
        }
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
        }
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~_Rb_tree(&local_60);
      local_138 = local_138 + 0x38;
    } while (local_138 != local_b0);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)&local_a8);
  return;
}

Assistant:

static void
test_39(QPDF& pdf, char const* arg2)
{
    // Display image filter and color set for each image on each page
    int pageno = 0;
    for (auto& page: QPDFPageDocumentHelper(pdf).getAllPages()) {
        std::cout << "page " << ++pageno << std::endl;
        std::map<std::string, QPDFObjectHandle> images = page.getImages();
        for (auto& i_iter: images) {
            QPDFObjectHandle image_dict = i_iter.second.getDict();
            std::cout << "filter: " << image_dict.getKey("/Filter").unparseResolved()
                      << ", color space: " << image_dict.getKey("/ColorSpace").unparseResolved()
                      << std::endl;
        }
    }
}